

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

uint __thiscall EventLoop::fireSocket(EventLoop *this,int fd,uint mode)

{
  bool bVar1;
  pointer ppVar2;
  undefined1 local_70 [8];
  function<void_(int,_unsigned_int)> callback;
  _Self local_38;
  iterator socket;
  unique_lock<std::mutex> locker;
  uint mode_local;
  int fd_local;
  EventLoop *this_local;
  
  locker._8_4_ = mode;
  locker._12_4_ = fd;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&socket,&this->mMutex);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>_>
       ::find(&this->mSockets,(key_type_conflict *)&locker.field_0xc);
  callback._M_invoker =
       (_Invoker_type)
       std::
       map<int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>_>
       ::end(&this->mSockets);
  bVar1 = std::operator!=(&local_38,(_Self *)&callback._M_invoker);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>
             ::operator->(&local_38);
    std::function<void_(int,_unsigned_int)>::function
              ((function<void_(int,_unsigned_int)> *)local_70,&(ppVar2->second).second);
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&socket);
    std::function<void_(int,_unsigned_int)>::operator()
              ((function<void_(int,_unsigned_int)> *)local_70,locker._12_4_,locker._8_4_);
    this_local._4_4_ = locker._8_4_;
    std::function<void_(int,_unsigned_int)>::~function
              ((function<void_(int,_unsigned_int)> *)local_70);
  }
  else {
    this_local._4_4_ = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&socket);
  return this_local._4_4_;
}

Assistant:

unsigned int EventLoop::fireSocket(int fd, unsigned int mode)
{
    std::unique_lock<std::mutex> locker(mMutex);
    const auto socket = mSockets.find(fd);
    if (socket != mSockets.end()) {
        const auto callback = socket->second.second;
        locker.unlock();
        RCT_CALLBACK(callback(fd, mode));
        return mode;
    }
    return 0;
}